

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_query_decoder.c
# Opt level: O0

int pt_qry_sync_backward(pt_query_decoder *decoder,uint64_t *ip)

{
  int iVar1;
  pt_config *ppVar2;
  uint8_t *puVar3;
  pt_config *config;
  int errcode;
  uint8_t *pos;
  uint8_t *sync;
  uint8_t *start;
  uint64_t *ip_local;
  pt_query_decoder *decoder_local;
  
  if (decoder == (pt_query_decoder *)0x0) {
    return -2;
  }
  sync = pt_qry_pos(decoder);
  if (sync == (uint8_t *)0x0) {
    ppVar2 = pt_qry_config(decoder);
    if (ppVar2 == (pt_config *)0x0) {
      return -1;
    }
    sync = ppVar2->end;
    if (sync == (uint8_t *)0x0) {
      return -10;
    }
  }
  pos = sync;
  do {
    while( true ) {
      iVar1 = pt_qry_reset(decoder);
      if (iVar1 < 0) {
        return iVar1;
      }
      do {
        iVar1 = pt_evt_sync_backward(&decoder->evdec);
        if (iVar1 < 0) {
          return iVar1;
        }
        puVar3 = pt_qry_pos(decoder);
      } while (pos <= puVar3);
      iVar1 = pt_qry_start(decoder,ip);
      pos = puVar3;
      if (iVar1 < 0) break;
      puVar3 = pt_qry_pos(decoder);
      if (puVar3 < sync) {
        return 0;
      }
    }
  } while (iVar1 == -7);
  return iVar1;
}

Assistant:

int pt_qry_sync_backward(struct pt_query_decoder *decoder, uint64_t *ip)
{
	const uint8_t *start, *sync, *pos;
	int errcode;

	if (!decoder)
		return -pte_invalid;

	start = pt_qry_pos(decoder);
	if (!start) {
		const struct pt_config *config;

		config = pt_qry_config(decoder);
		if (!config)
			return -pte_internal;

		start = config->end;
		if (!start)
			return -pte_bad_config;
	}

	sync = start;
	for (;;) {
		errcode = pt_qry_reset(decoder);
		if (errcode < 0)
			return errcode;

		do {
			errcode = pt_evt_sync_backward(&decoder->evdec);
			if (errcode < 0)
				return errcode;

			pos = pt_qry_pos(decoder);
		} while (sync <= pos);

		sync = pos;

		errcode = pt_qry_start(decoder, ip);
		if (errcode < 0) {
			/* Ignore incomplete trace segments at the end.  We
			 * need a full PSB+ to start decoding.
			 */
			if (errcode != -pte_eos)
				return errcode;

			continue;
		}

		/* When starting inside or right after PSB+, we may end up at
		 * the same PSB again.  Skip it.
		 */
		pos = pt_qry_pos(decoder);
		if (pos < start)
			break;
	}

	return 0;
}